

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yl_schema_features.c
# Opt level: O1

void print_features(ly_out *out,lys_module *mod)

{
  undefined8 uVar1;
  uint in_EAX;
  int iVar2;
  undefined8 *puVar3;
  size_t sVar4;
  char *pcVar5;
  ulong uVar6;
  uint32_t idx;
  undefined8 uStack_38;
  
  uVar6 = 0;
  uStack_38._0_4_ = in_EAX;
  ly_print(out,"%s:\n",mod->name);
  uStack_38 = (ulong)(uint)uStack_38;
  puVar3 = (undefined8 *)lysp_feature_next(0,mod->parsed);
  if (puVar3 != (undefined8 *)0x0) {
    uVar6 = 0;
    do {
      sVar4 = strlen((char *)*puVar3);
      if (uVar6 <= sVar4) {
        uVar6 = sVar4;
      }
      puVar3 = (undefined8 *)lysp_feature_next(puVar3,mod->parsed,(long)&uStack_38 + 4);
    } while (puVar3 != (undefined8 *)0x0);
  }
  if (uVar6 == 0) {
    ly_print(out,"\t(none)\n");
  }
  else {
    uStack_38 = uStack_38 & 0xffffffff;
    puVar3 = (undefined8 *)lysp_feature_next(0,mod->parsed);
    if (puVar3 != (undefined8 *)0x0) {
      do {
        uVar1 = *puVar3;
        iVar2 = lys_feature_value(mod,uVar1);
        pcVar5 = "off";
        if (iVar2 == 0) {
          pcVar5 = "on";
        }
        ly_print(out,"\t%-*s (%s)\n",uVar6 & 0xffffffff,uVar1,pcVar5);
        puVar3 = (undefined8 *)lysp_feature_next(puVar3,mod->parsed,(long)&uStack_38 + 4);
      } while (puVar3 != (undefined8 *)0x0);
    }
  }
  return;
}

Assistant:

void
print_features(struct ly_out *out, const struct lys_module *mod)
{
    struct lysp_feature *f;
    uint32_t idx;
    size_t max_len, len;

    ly_print(out, "%s:\n", mod->name);

    /* get max len, so the statuses of all the features will be aligned */
    max_len = 0, idx = 0, f = NULL;
    while ((f = lysp_feature_next(f, mod->parsed, &idx))) {
        len = strlen(f->name);
        max_len = (max_len > len) ? max_len : len;
    }
    if (!max_len) {
        ly_print(out, "\t(none)\n");
        return;
    }

    /* print features */
    idx = 0, f = NULL;
    while ((f = lysp_feature_next(f, mod->parsed, &idx))) {
        ly_print(out, "\t%-*s (%s)\n", (int)max_len, f->name, lys_feature_value(mod, f->name) ? "off" : "on");
    }
}